

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O3

Function * wasm::generateBinaryFunc(Module *wasm,Binary *curr)

{
  BinaryOp BVar1;
  Type TVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Binary *this;
  Const *pCVar5;
  Binary *pBVar6;
  Binary *this_00;
  Binary *this_01;
  Unary *this_02;
  If *this_03;
  MixedArena *this_04;
  initializer_list<wasm::Type> types;
  Signature sig;
  Name NVar7;
  Name name;
  Literal local_110;
  Literal local_f8;
  Literal local_e0;
  Literal local_c8;
  Type local_b0;
  HeapType local_a8;
  Binary *local_a0;
  Const *local_98;
  undefined1 local_90 [8];
  Literal minLit;
  Literal zeroLit;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder local_40;
  Builder builder;
  
  BVar1 = curr->op;
  TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  builder.wasm._7_1_ = TVar2.id == 3;
  this_04 = &wasm->allocator;
  local_a0 = curr;
  local_40.wasm = wasm;
  pEVar3 = (Expression *)MixedArena::allocSpace(this_04,0x18,8);
  pEVar3->_id = LocalGetId;
  pEVar3[1]._id = InvalidId;
  (pEVar3->type).id = TVar2.id;
  pEVar4 = (Expression *)MixedArena::allocSpace(this_04,0x18,8);
  pEVar4->_id = LocalGetId;
  pEVar4[1]._id = BlockId;
  (pEVar4->type).id = TVar2.id;
  this = (Binary *)MixedArena::allocSpace(this_04,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this->op = BVar1;
  this->left = pEVar3;
  this->right = pEVar4;
  builder.wasm._0_4_ = BVar1;
  Binary::finalize(this);
  if (TVar2.id == 3) {
    local_90 = (undefined1  [8])0x8000000000000000;
    minLit.field_0.func.super_IString.str._M_str = (char *)0x3;
    minLit.type.id = 0;
    zeroLit.field_0.func.super_IString.str._M_str = (char *)0x3;
    if ((BinaryOp)builder.wasm != DivSInt64) goto LAB_008b0ff5;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0xffffffffffffffff;
    builder.wasm._0_4_ = EqInt64;
  }
  else {
    local_90._0_4_ = 0x80000000;
    minLit.field_0.func.super_IString.str._M_str = (char *)0x2;
    minLit.type.id = (ulong)minLit.type.id._4_4_ << 0x20;
    zeroLit.field_0.func.super_IString.str._M_str = (char *)0x2;
    if ((BinaryOp)builder.wasm != DivSInt32) goto LAB_008b0ff5;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    builder.wasm._0_4_ = EqInt32;
  }
  pEVar3 = (Expression *)MixedArena::allocSpace(this_04,0x18,8);
  pEVar3->_id = LocalGetId;
  pEVar3[1]._id = InvalidId;
  (pEVar3->type).id = TVar2.id;
  Literal::Literal(&local_110,(Literal *)local_90);
  pCVar5 = Builder::makeConst(&local_40,&local_110);
  pBVar6 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar6->op = (BinaryOp)builder.wasm;
  pBVar6->left = pEVar3;
  pBVar6->right = (Expression *)pCVar5;
  Binary::finalize(pBVar6);
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  pEVar3[1]._id = BlockId;
  (pEVar3->type).id = TVar2.id;
  Literal::Literal(&local_f8,(Literal *)&func);
  local_98 = Builder::makeConst(&local_40,&local_f8);
  this_00 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = (BinaryOp)builder.wasm;
  this_00->left = pEVar3;
  this_00->right = (Expression *)local_98;
  Binary::finalize(this_00);
  this_01 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = AndInt32;
  this_01->left = (Expression *)pBVar6;
  this_01->right = (Expression *)this_00;
  Binary::finalize(this_01);
  Literal::Literal(&local_e0,(Literal *)&minLit.type);
  pCVar5 = Builder::makeConst(&local_40,&local_e0);
  pBVar6 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = IfId;
  (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  *(Binary **)&pBVar6->op = this_01;
  pBVar6->left = (Expression *)pCVar5;
  pBVar6->right = (Expression *)this;
  If::finalize((If *)pBVar6);
  Literal::~Literal(&local_e0);
  Literal::~Literal(&local_f8);
  Literal::~Literal(&local_110);
  Literal::~Literal((Literal *)&func);
  this = pBVar6;
LAB_008b0ff5:
  types._M_len = 2;
  types._M_array = (iterator)&func;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)TVar2.id;
  Type::Type(&local_b0,types);
  NVar7 = getBinaryFuncName(local_a0);
  sig.results.id = TVar2.id;
  sig.params.id = local_b0.id;
  HeapType::HeapType(&local_a8,sig);
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0;
  name.super_IString.str._M_str = NVar7.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&zeroLit.type;
  Builder::makeFunction
            (name,(HeapType)NVar7.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_a8.id,(Expression *)&func);
  if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
      func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
    operator_delete((void *)func._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                    -(long)func._M_t.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  }
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  pEVar3[1]._id = BlockId;
  (pEVar3->type).id = TVar2.id;
  this_02 = (Unary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_02->op = builder.wasm._7_1_ | EqZInt32;
  this_02->value = pEVar3;
  Unary::finalize(this_02);
  Literal::Literal(&local_c8,(Literal *)&minLit.type);
  pCVar5 = Builder::makeConst(&local_40,&local_c8);
  this_03 = (If *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_03->condition = (Expression *)this_02;
  this_03->ifTrue = (Expression *)pCVar5;
  this_03->ifFalse = (Expression *)this;
  If::finalize(this_03);
  *(If **)(zeroLit.type.id + 0x60) = this_03;
  Literal::~Literal(&local_c8);
  TVar2 = zeroLit.type;
  zeroLit.type.id = 0;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&zeroLit.type);
  Literal::~Literal((Literal *)&minLit.type);
  Literal::~Literal((Literal *)local_90);
  return (Function *)TVar2.id;
}

Assistant:

Function* generateBinaryFunc(Module& wasm, Binary* curr) {
  BinaryOp op = curr->op;
  Type type = curr->type;
  bool isI64 = type == Type::i64;
  Builder builder(wasm);
  Expression* result = builder.makeBinary(
    op, builder.makeLocalGet(0, type), builder.makeLocalGet(1, type));
  BinaryOp divSIntOp = isI64 ? DivSInt64 : DivSInt32;
  UnaryOp eqZOp = isI64 ? EqZInt64 : EqZInt32;
  Literal minLit = isI64 ? Literal(std::numeric_limits<int64_t>::min())
                         : Literal(std::numeric_limits<int32_t>::min());
  Literal zeroLit = isI64 ? Literal(int64_t(0)) : Literal(int32_t(0));
  if (op == divSIntOp) {
    // guard against signed division overflow
    BinaryOp eqOp = isI64 ? EqInt64 : EqInt32;
    Literal negLit = isI64 ? Literal(int64_t(-1)) : Literal(int32_t(-1));
    result = builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          eqOp, builder.makeLocalGet(0, type), builder.makeConst(minLit)),
        builder.makeBinary(
          eqOp, builder.makeLocalGet(1, type), builder.makeConst(negLit))),
      builder.makeConst(zeroLit),
      result);
  }
  auto funcSig = Signature({type, type}, type);
  auto func = Builder::makeFunction(getBinaryFuncName(curr), funcSig, {});
  func->body =
    builder.makeIf(builder.makeUnary(eqZOp, builder.makeLocalGet(1, type)),
                   builder.makeConst(zeroLit),
                   result);
  // TODO: use unique_ptr properly and do not release ownership.
  return func.release();
}